

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

locale __thiscall
booster::locale::impl_std::create_parsing
          (impl_std *this,locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  locale *plVar1;
  numpunct_byname<wchar_t> *__f;
  moneypunct_byname<wchar_t,_true> *__f_00;
  moneypunct_byname<wchar_t,_false> *__f_01;
  utf8_numpunct_from_wide *puVar2;
  utf8_moneypunct_from_wide<true> *puVar3;
  utf8_moneypunct_from_wide<false> *puVar4;
  base_num_parse<char> *pbVar5;
  base_num_parse<wchar_t> *__f_02;
  utf8_numpunct *__f_03;
  utf8_moneypunct<true> *__f_04;
  utf8_moneypunct<false> *__f_05;
  locale *tmp_3;
  locale base;
  locale tmp;
  locale lStack_38;
  locale local_30;
  locale local_28;
  
  if (type == 2) {
    create_basic_parsing<wchar_t>(this,in,locale_name);
    __f_02 = (base_num_parse<wchar_t> *)operator_new(0x10);
    *(undefined4 *)&__f_02->field_0x8 = 0;
    *(undefined ***)__f_02 = &PTR__facet_001d1c10;
    std::locale::locale<booster::locale::util::base_num_parse<wchar_t>>(&lStack_38,in,__f_02);
LAB_001a3a3a:
    std::locale::operator=((locale *)this,&lStack_38);
  }
  else {
    if (type != 1) {
      std::locale::locale((locale *)this,in);
      return (locale)(_Impl *)this;
    }
    if (utf == utf8_native) {
      __f_03 = (utf8_numpunct *)operator_new(0x18);
      std::__cxx11::numpunct_byname<char>::numpunct_byname
                ((char *)__f_03,(ulong)(locale_name->_M_dataplus)._M_p);
      *(undefined ***)__f_03 = &PTR__numpunct_001d1ef8;
      std::locale::locale<booster::locale::impl_std::utf8_numpunct>(&lStack_38,in,__f_03);
      __f_04 = (utf8_moneypunct<true> *)operator_new(0x18);
      std::__cxx11::moneypunct_byname<char,true>::moneypunct_byname
                ((char *)__f_04,(ulong)(locale_name->_M_dataplus)._M_p);
      *(undefined ***)__f_04 = &PTR__moneypunct_001d2100;
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<true>>
                (&local_30,&lStack_38,__f_04);
      std::locale::operator=(&lStack_38,&local_30);
      std::locale::~locale(&local_30);
      __f_05 = (utf8_moneypunct<false> *)operator_new(0x18);
      std::__cxx11::moneypunct_byname<char,false>::moneypunct_byname
                ((char *)__f_05,(ulong)(locale_name->_M_dataplus)._M_p);
      *(undefined ***)__f_05 = &PTR__moneypunct_001d2180;
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<false>>
                (&local_30,&lStack_38,__f_05);
      std::locale::operator=(&lStack_38,&local_30);
      std::locale::~locale(&local_30);
      pbVar5 = (base_num_parse<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar5->field_0x8 = 0;
      *(undefined ***)pbVar5 = &PTR__facet_001d1b80;
      std::locale::locale<booster::locale::util::base_num_parse<char>>
                ((locale *)this,&lStack_38,pbVar5);
      goto LAB_001a3c68;
    }
    if (utf == utf8_native_with_wide) {
      std::locale::locale(&lStack_38,(locale_name->_M_dataplus)._M_p);
      puVar2 = (utf8_numpunct_from_wide *)operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(puVar2,&lStack_38,0);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>(&local_30,in,puVar2);
      puVar3 = (utf8_moneypunct_from_wide<true> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide(puVar3,&lStack_38,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (&local_28,&local_30,puVar3);
      std::locale::operator=(&local_30,&local_28);
      std::locale::~locale(&local_28);
      puVar4 = (utf8_moneypunct_from_wide<false> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide(puVar4,&lStack_38,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (&local_28,&local_30,puVar4);
      std::locale::operator=(&local_30,&local_28);
      std::locale::~locale(&local_28);
      pbVar5 = (base_num_parse<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar5->field_0x8 = 0;
      *(undefined ***)pbVar5 = &PTR__facet_001d1b80;
      std::locale::locale<booster::locale::util::base_num_parse<char>>
                ((locale *)this,&local_30,pbVar5);
    }
    else {
      if (utf != utf8_from_wide) {
        create_basic_parsing<char>(this,in,locale_name);
        pbVar5 = (base_num_parse<char> *)operator_new(0x10);
        *(undefined4 *)&pbVar5->field_0x8 = 0;
        *(undefined ***)pbVar5 = &PTR__facet_001d1b80;
        std::locale::locale<booster::locale::util::base_num_parse<char>>(&lStack_38,in,pbVar5);
        goto LAB_001a3a3a;
      }
      plVar1 = (locale *)std::locale::classic();
      std::locale::locale(&lStack_38,plVar1);
      __f = (numpunct_byname<wchar_t> *)operator_new(0x18);
      std::__cxx11::numpunct_byname<wchar_t>::numpunct_byname
                ((char *)__f,(ulong)(locale_name->_M_dataplus)._M_p);
      std::locale::locale<std::__cxx11::numpunct_byname<wchar_t>>(&local_30,&lStack_38,__f);
      std::locale::operator=(&lStack_38,&local_30);
      std::locale::~locale(&local_30);
      __f_00 = (moneypunct_byname<wchar_t,_true> *)operator_new(0x18);
      std::__cxx11::moneypunct_byname<wchar_t,true>::moneypunct_byname
                ((char *)__f_00,(ulong)(locale_name->_M_dataplus)._M_p);
      std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,true>>
                (&local_30,&lStack_38,__f_00);
      std::locale::operator=(&lStack_38,&local_30);
      std::locale::~locale(&local_30);
      __f_01 = (moneypunct_byname<wchar_t,_false> *)operator_new(0x18);
      std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname
                ((char *)__f_01,(ulong)(locale_name->_M_dataplus)._M_p);
      std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,false>>
                (&local_30,&lStack_38,__f_01);
      std::locale::operator=(&lStack_38,&local_30);
      std::locale::~locale(&local_30);
      puVar2 = (utf8_numpunct_from_wide *)operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(puVar2,&lStack_38,0);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>(&local_30,in,puVar2);
      puVar3 = (utf8_moneypunct_from_wide<true> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide(puVar3,&lStack_38,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (&local_28,&local_30,puVar3);
      std::locale::operator=(&local_30,&local_28);
      std::locale::~locale(&local_28);
      puVar4 = (utf8_moneypunct_from_wide<false> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide(puVar4,&lStack_38,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (&local_28,&local_30,puVar4);
      std::locale::operator=(&local_30,&local_28);
      std::locale::~locale(&local_28);
      pbVar5 = (base_num_parse<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar5->field_0x8 = 0;
      *(undefined ***)pbVar5 = &PTR__facet_001d1b80;
      std::locale::locale<booster::locale::util::base_num_parse<char>>
                ((locale *)this,&local_30,pbVar5);
    }
    std::locale::~locale(&local_30);
  }
LAB_001a3c68:
  std::locale::~locale(&lStack_38);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_parsing( std::locale const &in,
                            std::string const &locale_name,
                            character_facet_type type,
                            utf8_support utf)
{
        switch(type) {
        case char_facet:
            {
                if(utf == utf8_from_wide ) {
                    std::locale base = std::locale::classic();
                    
                    base = std::locale(base,new std::numpunct_byname<wchar_t>(locale_name.c_str()));
                    base = std::locale(base,new std::moneypunct_byname<wchar_t,true>(locale_name.c_str()));
                    base = std::locale(base,new std::moneypunct_byname<wchar_t,false>(locale_name.c_str()));

                    std::locale tmp = std::locale(in,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_parse<char>());
                }
                else if(utf == utf8_native) {
                    std::locale tmp = std::locale(in,new utf8_numpunct(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<true>(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<false>(locale_name.c_str()));
                    return std::locale(tmp,new util::base_num_parse<char>());
                }
                else if(utf == utf8_native_with_wide) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_parse<char>());
                }
                else 
                {
                    std::locale tmp = create_basic_parsing<char>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<char>());
                    return tmp;
                }
            }
        case wchar_t_facet:
                {
                    std::locale tmp = create_basic_parsing<wchar_t>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<wchar_t>());
                    return tmp;
                }
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
                {
                    std::locale tmp = create_basic_parsing<char16_t>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<char16_t>());
                    return tmp;
                }
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
                {
                    std::locale tmp = create_basic_parsing<char32_t>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<char32_t>());
                    return tmp;
                }
        #endif
        default:
            return in;
        }
}